

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O2

bool __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
::UpdatePointToAttributeIndexMapping
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
           *this,PointAttribute *attribute)

{
  uint uVar1;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar2;
  uint uVar3;
  CornerTable *pCVar4;
  Mesh *pMVar5;
  MeshAttributeIndicesEncodingData *pMVar6;
  ulong uVar7;
  pointer paVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int p;
  ulong uVar12;
  ulong uVar13;
  
  pCVar4 = (this->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .corner_table_;
  PointAttribute::SetExplicitMapping(attribute,(ulong)(this->mesh_->super_PointCloud).num_points_);
  pMVar5 = this->mesh_;
  paVar8 = (pMVar5->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (pMVar5->super_PointCloud).num_points_;
  uVar7 = ((long)(pMVar5->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar8) / 0xc & 0xffffffff;
  uVar9 = 0xffffffff;
  iVar10 = 0;
  for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    pMVar6 = this->encoding_data_;
    for (uVar12 = 0; uVar12 != 3; uVar12 = uVar12 + 1) {
      if ((((uVar9 == uVar12) ||
           (uVar13 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(uint)(iVar10 + (int)uVar12)].
                            value_, uVar13 == 0xffffffff)) ||
          (IVar2.value_ = paVar8->_M_elems[uVar12].value_, uVar1 <= IVar2.value_)) ||
         (uVar3 = (pMVar6->vertex_to_encoded_attribute_value_index_map).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[uVar13], uVar1 <= uVar3)) goto LAB_0012e2f7;
      (attribute->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[IVar2.value_].value_ = uVar3;
    }
    uVar9 = uVar9 - 3;
    iVar10 = iVar10 + 3;
    paVar8 = paVar8 + 1;
  }
LAB_0012e2f7:
  return uVar7 <= uVar11;
}

Assistant:

bool UpdatePointToAttributeIndexMapping(PointAttribute *attribute) override {
    const auto *corner_table = traverser_.corner_table();
    attribute->SetExplicitMapping(mesh_->num_points());
    const size_t num_faces = mesh_->num_faces();
    const size_t num_points = mesh_->num_points();
    for (FaceIndex f(0); f < static_cast<uint32_t>(num_faces); ++f) {
      const auto &face = mesh_->face(f);
      for (int p = 0; p < 3; ++p) {
        const PointIndex point_id = face[p];
        const VertexIndex vert_id =
            corner_table->Vertex(CornerIndex(3 * f.value() + p));
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        const AttributeValueIndex att_entry_id(
            encoding_data_
                ->vertex_to_encoded_attribute_value_index_map[vert_id.value()]);
        if (point_id >= num_points || att_entry_id.value() >= num_points) {
          // There cannot be more attribute values than the number of points.
          return false;
        }
        attribute->SetPointMapEntry(point_id, att_entry_id);
      }
    }
    return true;
  }